

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O2

string * __thiscall
helics::ValueFederateManager::localQuery_abi_cxx11_
          (string *__return_storage_ptr__,ValueFederateManager *this,string_view queryStr)

{
  DataType DVar1;
  _func_int *p_Var2;
  bool bVar3;
  string *psVar4;
  Input *pIVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  int iVar6;
  unique_lock<std::mutex> *this_00;
  double dVar7;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  const_iterator __begin5;
  const_iterator __begin0;
  JsonBuilder JB;
  unique_lock<std::mutex> local_1a8;
  const_iterator __end0;
  shared_handle hand;
  Input inpTemp;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __y._M_str = "inputs";
  __y._M_len = 6;
  bVar3 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)queryStr,__y);
  if (bVar3) {
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::lock_shared((shared_handle *)&JB,&this->inputs);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&__begin5,"[",(allocator<char> *)&inpTemp);
    gmlc::containers::StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::begin
              (&__begin0,
               (StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_> *)
               JB.jMap._M_t.
               super___uniq_ptr_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
               .
               super__Head_base<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_false>
               ._M_head_impl);
    gmlc::containers::StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end
              (&__end0,(StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_> *)
                       JB.jMap._M_t.
                       super___uniq_ptr_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                       .
                       super__Head_base<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_false>
                       ._M_head_impl);
    while ((pIVar5 = __begin0.ptr, __begin0.offset != __end0.offset || (__begin0.vec != __end0.vec))
          ) {
      psVar4 = Interface::getName_abi_cxx11_(&(__begin0.ptr)->super_Interface);
      if (psVar4->_M_string_length != 0) {
        psVar4 = Interface::getName_abi_cxx11_(&pIVar5->super_Interface);
        std::__cxx11::string::string
                  ((string *)&hand,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar4);
        generateJsonQuotedString((string *)&inpTemp,(string *)&hand);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin5,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inpTemp);
        std::__cxx11::string::~string((string *)&inpTemp);
        std::__cxx11::string::~string((string *)&hand);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin5,','
                 );
      }
      gmlc::containers::BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*>::
      operator++(&__begin0);
    }
    if (__begin5.ptr < (Input *)0x2) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin5,']');
    }
    else {
LAB_001bebf8:
      *(undefined1 *)((long)__begin5.vec + -1 + (long)__begin5.ptr) = 0x5d;
    }
  }
  else {
    __y_00._M_str = "publications";
    __y_00._M_len = 0xc;
    bVar3 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)queryStr,__y_00);
    if (bVar3) {
      gmlc::libguarded::
      shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
      ::lock_shared((shared_handle *)&JB,&this->publications);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&__begin5,"[",(allocator<char> *)&inpTemp);
      gmlc::containers::
      StableBlockVector<helics::Publication,_5U,_std::allocator<helics::Publication>_>::begin
                ((const_iterator *)&__begin0,
                 (StableBlockVector<helics::Publication,_5U,_std::allocator<helics::Publication>_> *
                 )JB.jMap._M_t.
                  super___uniq_ptr_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                  .
                  super__Head_base<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_false>
                  ._M_head_impl);
      gmlc::containers::
      StableBlockVector<helics::Publication,_5U,_std::allocator<helics::Publication>_>::end
                ((const_iterator *)&__end0,
                 (StableBlockVector<helics::Publication,_5U,_std::allocator<helics::Publication>_> *
                 )JB.jMap._M_t.
                  super___uniq_ptr_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                  .
                  super__Head_base<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_false>
                  ._M_head_impl);
      while ((pIVar5 = __begin0.ptr, __begin0.offset != __end0.offset ||
             (__begin0.vec != __end0.vec))) {
        psVar4 = Interface::getName_abi_cxx11_(&(__begin0.ptr)->super_Interface);
        if (psVar4->_M_string_length != 0) {
          psVar4 = Interface::getName_abi_cxx11_(&pIVar5->super_Interface);
          std::__cxx11::string::string
                    ((string *)&hand,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar4);
          generateJsonQuotedString((string *)&inpTemp,(string *)&hand);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin5,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inpTemp);
          std::__cxx11::string::~string((string *)&inpTemp);
          std::__cxx11::string::~string((string *)&hand);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin5,
                    ',');
        }
        gmlc::containers::
        BlockIterator<const_helics::Publication,_32,_const_helics::Publication_*const_*>::operator++
                  ((BlockIterator<const_helics::Publication,_32,_const_helics::Publication_*const_*>
                    *)&__begin0);
      }
      if ((Input *)0x1 < __begin5.ptr) goto LAB_001bebf8;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin5,']');
    }
    else {
      __y_01._M_str = "subscriptions";
      __y_01._M_len = 0xd;
      bVar3 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)queryStr,__y_01);
      if (bVar3) {
        gmlc::libguarded::
        shared_guarded_opt<std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>,_std::shared_mutex>
        ::lock_shared((shared_handle *)&__begin0,&this->targetIDs);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&__begin5,"[",(allocator<char> *)&inpTemp);
        for (pIVar5 = __begin0.vec[3]; pIVar5 != (Input *)(__begin0.vec + 1);
            pIVar5 = (Input *)std::_Rb_tree_increment((_Rb_tree_node_base *)pIVar5)) {
          std::__cxx11::string::string
                    ((string *)&hand,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &(pIVar5->super_Interface).mName._M_string_length);
          generateJsonQuotedString((string *)&inpTemp,(string *)&hand);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin5,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inpTemp);
          std::__cxx11::string::~string((string *)&inpTemp);
          std::__cxx11::string::~string((string *)&hand);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin5,
                    ',');
        }
        if (__begin5.ptr < (Input *)0x2) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin5,
                    ']');
        }
        else {
          *(undefined1 *)((long)__begin5.vec + -1 + (long)__begin5.ptr) = 0x5d;
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin5);
        std::__cxx11::string::~string((string *)&__begin5);
        std::shared_lock<std::shared_mutex>::~shared_lock
                  ((shared_lock<std::shared_mutex> *)&__begin0.ptr);
        return __return_storage_ptr__;
      }
      __y_02._M_str = "updated_input_indices";
      __y_02._M_len = 0x15;
      bVar3 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)queryStr,__y_02);
      if (bVar3) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,"[");
        gmlc::libguarded::
        shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
        ::lock(&hand,&this->inputs);
        gmlc::containers::StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::
        begin(&__begin5,&(hand.data)->dataStorage);
        gmlc::containers::StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end
                  (&__begin0,&(hand.data)->dataStorage);
        iVar6 = 0;
        while ((__begin5.offset != __begin0.offset || (__begin5.vec != __begin0.vec))) {
          bVar3 = Input::isUpdated(__begin5.ptr);
          if (bVar3) {
            CLI::std::__cxx11::to_string((string *)&inpTemp,iVar6);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inpTemp);
            std::__cxx11::string::~string((string *)&inpTemp);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,',');
          }
          iVar6 = iVar6 + 1;
          gmlc::containers::BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*>::
          operator++(&__begin5);
        }
        if ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1]
            == ',') {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__);
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,']');
        this_00 = &hand.m_handle_lock;
        goto LAB_001bed29;
      }
      __y_03._M_str = "updated_input_names";
      __y_03._M_len = 0x13;
      bVar3 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)queryStr,__y_03);
      if (!bVar3) {
        __y_04._M_str = "updates";
        __y_04._M_len = 7;
        bVar3 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)queryStr,__y_04);
        if (bVar3) {
          fileops::JsonBuilder::JsonBuilder(&JB);
          gmlc::libguarded::
          shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
          ::lock_shared((shared_handle *)&__begin5,&this->inputs);
          gmlc::containers::StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::
          begin(&__begin0,
                (StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_> *)__begin5.vec
               );
          gmlc::containers::StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::
          end(&__end0,(StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_> *)
                      __begin5.vec);
          while ((pIVar5 = __begin0.ptr, __begin0.offset != __end0.offset ||
                 (__begin0.vec != __end0.vec))) {
            bVar3 = Input::isUpdated(__begin0.ptr);
            if (bVar3) {
              Input::Input(&inpTemp,pIVar5);
              if ((inpTemp.targetType == HELICS_ANY) ||
                 (DVar1 = inpTemp.targetType, inpTemp.targetType == HELICS_UNKNOWN)) {
                DVar1 = pIVar5->injectionType;
              }
              p_Var2 = (pIVar5->super_Interface)._vptr_Interface[4];
              if (DVar1 == HELICS_VECTOR) {
                iVar6 = (*p_Var2)(pIVar5);
                Input::getValue_impl<std::vector<double,std::allocator<double>>>
                          ((string *)&hand,&inpTemp);
                fileops::JsonBuilder::addElement
                          (&JB,(string *)CONCAT44(extraout_var_01,iVar6),
                           (vector<double,_std::allocator<double>_> *)&hand);
                CLI::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                          ((_Vector_base<double,_std::allocator<double>_> *)&hand);
              }
              else if (DVar1 == HELICS_DOUBLE) {
                iVar6 = (*p_Var2)(pIVar5);
                dVar7 = Input::getValue_impl<double>(&inpTemp);
                fileops::JsonBuilder::addElement
                          (&JB,(string *)CONCAT44(extraout_var_00,iVar6),dVar7);
              }
              else {
                iVar6 = (*p_Var2)(pIVar5);
                Input::getValue_impl<std::__cxx11::string>((string *)&hand,&inpTemp);
                fileops::JsonBuilder::addElement
                          (&JB,(string *)CONCAT44(extraout_var_02,iVar6),(string *)&hand);
                std::__cxx11::string::~string((string *)&hand);
              }
              Input::~Input(&inpTemp);
            }
            gmlc::containers::BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*>::
            operator++(&__begin0);
          }
          std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&__begin5.ptr);
          fileops::JsonBuilder::generate_abi_cxx11_((string *)&inpTemp,&JB);
        }
        else {
          __y_05._M_str = "values";
          __y_05._M_len = 6;
          bVar3 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)queryStr,__y_05)
          ;
          if (!bVar3) {
            return __return_storage_ptr__;
          }
          fileops::JsonBuilder::JsonBuilder(&JB);
          gmlc::libguarded::
          shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
          ::lock_shared((shared_handle *)&__begin5,&this->inputs);
          gmlc::containers::StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::
          begin(&__begin0,
                (StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_> *)__begin5.vec
               );
          gmlc::containers::StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::
          end(&__end0,(StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_> *)
                      __begin5.vec);
          while ((pIVar5 = __begin0.ptr, __begin0.offset != __end0.offset ||
                 (__begin0.vec != __end0.vec))) {
            Input::Input(&inpTemp,__begin0.ptr);
            Input::checkUpdate(&inpTemp,true);
            if ((inpTemp.targetType == HELICS_ANY) ||
               (DVar1 = inpTemp.targetType, inpTemp.targetType == HELICS_UNKNOWN)) {
              DVar1 = pIVar5->injectionType;
            }
            p_Var2 = (pIVar5->super_Interface)._vptr_Interface[4];
            if (DVar1 == HELICS_VECTOR) {
              iVar6 = (*p_Var2)(pIVar5);
              Input::getValue_impl<std::vector<double,std::allocator<double>>>
                        ((string *)&hand,&inpTemp);
              fileops::JsonBuilder::addElement
                        (&JB,(string *)CONCAT44(extraout_var_04,iVar6),
                         (vector<double,_std::allocator<double>_> *)&hand);
              CLI::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                        ((_Vector_base<double,_std::allocator<double>_> *)&hand);
            }
            else if (DVar1 == HELICS_DOUBLE) {
              iVar6 = (*p_Var2)(pIVar5);
              dVar7 = Input::getValue_impl<double>(&inpTemp);
              fileops::JsonBuilder::addElement(&JB,(string *)CONCAT44(extraout_var_03,iVar6),dVar7);
            }
            else {
              iVar6 = (*p_Var2)(pIVar5);
              Input::getValue_impl<std::__cxx11::string>((string *)&hand,&inpTemp);
              fileops::JsonBuilder::addElement
                        (&JB,(string *)CONCAT44(extraout_var_05,iVar6),(string *)&hand);
              std::__cxx11::string::~string((string *)&hand);
            }
            Input::~Input(&inpTemp);
            gmlc::containers::BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*>::
            operator++(&__begin0);
          }
          std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&__begin5.ptr);
          fileops::JsonBuilder::generate_abi_cxx11_((string *)&inpTemp,&JB);
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inpTemp);
        std::__cxx11::string::~string((string *)&inpTemp);
        fileops::JsonBuilder::~JsonBuilder(&JB);
        return __return_storage_ptr__;
      }
      gmlc::libguarded::
      shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
      ::lock_shared((shared_handle *)&JB,&this->inputs);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&__begin5,"[",(allocator<char> *)&inpTemp);
      gmlc::containers::StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::begin
                (&__begin0,
                 (StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_> *)
                 JB.jMap._M_t.
                 super___uniq_ptr_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                 .
                 super__Head_base<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_false>
                 ._M_head_impl);
      gmlc::containers::StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end
                (&__end0,(StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_> *)
                         JB.jMap._M_t.
                         super___uniq_ptr_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                         .
                         super__Head_base<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_false>
                         ._M_head_impl);
      while ((pIVar5 = __begin0.ptr, __begin0.offset != __end0.offset ||
             (__begin0.vec != __end0.vec))) {
        bVar3 = Input::isUpdated(__begin0.ptr);
        if (bVar3) {
          iVar6 = (*(pIVar5->super_Interface)._vptr_Interface[4])(pIVar5);
          std::__cxx11::string::string
                    ((string *)&hand,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var,iVar6));
          generateJsonQuotedString((string *)&inpTemp,(string *)&hand);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin5,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inpTemp);
          std::__cxx11::string::~string((string *)&inpTemp);
          std::__cxx11::string::~string((string *)&hand);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin5,
                    ',');
        }
        gmlc::containers::BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*>::
        operator++(&__begin0);
      }
      if ((Input *)0x1 < __begin5.ptr) goto LAB_001bebf8;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin5,']');
    }
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin5);
  std::__cxx11::string::~string((string *)&__begin5);
  this_00 = &local_1a8;
LAB_001bed29:
  std::unique_lock<std::mutex>::~unique_lock(this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string ValueFederateManager::localQuery(std::string_view queryStr) const
{
    std::string ret;
    if (queryStr == "inputs") {
        ret = generateStringVector_if(
            inputs.lock_shared(),
            [](const auto& info) { return info.getName(); },
            [](const auto& info) { return (!info.getName().empty()); });
    } else if (queryStr == "publications") {
        ret = generateStringVector_if(
            publications.lock_shared(),
            [](const auto& info) { return info.getName(); },
            [](const auto& info) { return (!info.getName().empty()); });
    } else if (queryStr == "subscriptions") {
        ret = generateStringVector(targetIDs.lock_shared(),
                                   [](const auto& target) { return target.first; });
    } else if (queryStr == "updated_input_indices") {
        ret = "[";
        auto hand = inputs.lock();
        int ii = 0;
        for (const auto& inp : *hand) {
            if (inp.isUpdated()) {
                ret.append(std::to_string(ii));
                ret.push_back(',');
            }
            ++ii;
        }
        if (ret.back() == ',') {
            ret.pop_back();
        }
        ret.push_back(']');
    } else if (queryStr == "updated_input_names") {
        ret = generateStringVector_if(
            inputs.lock_shared(),
            [](const auto& inp) { return inp.getDisplayName(); },
            [](const auto& inp) { return (inp.isUpdated()); });
    } else if (queryStr == "updates") {
        fileops::JsonBuilder JB;
        for (const auto& inp : inputs.lock_shared()) {
            if (inp.isUpdated()) {
                auto inpTemp = inp;
                auto iType = inpTemp.getHelicsType();
                if (iType == DataType::HELICS_ANY || iType == DataType::HELICS_UNKNOWN) {
                    iType = inp.getHelicsInjectionType();
                }
                if (iType == DataType::HELICS_DOUBLE) {
                    JB.addElement(inp.getDisplayName(), inpTemp.getValue<double>());
                } else if (iType == DataType::HELICS_VECTOR) {
                    JB.addElement(inp.getDisplayName(), inpTemp.getValue<std::vector<double>>());
                } else {
                    JB.addElement(inp.getDisplayName(), inpTemp.getValue<std::string>());
                }
            }
        }
        ret = JB.generate();
    } else if (queryStr == "values") {
        fileops::JsonBuilder JB;
        for (const auto& inp : inputs.lock_shared()) {
            auto inpTemp = inp;
            inpTemp.checkUpdate(true);
            auto iType = inpTemp.getHelicsType();
            if (iType == DataType::HELICS_ANY || iType == DataType::HELICS_UNKNOWN) {
                iType = inp.getHelicsInjectionType();
            }
            if (iType == DataType::HELICS_DOUBLE) {
                JB.addElement(inp.getDisplayName(), inpTemp.getValue<double>());
            } else if (iType == DataType::HELICS_VECTOR) {
                JB.addElement(inp.getDisplayName(), inpTemp.getValue<std::vector<double>>());
            } else {
                JB.addElement(inp.getDisplayName(), inpTemp.getValue<std::string>());
            }
        }
        ret = JB.generate();
    }
    return ret;
}